

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag_quad_thresh.c
# Opt level: O2

void fit_line(line_fit_pt *lfps,int sz,int i0,int i1,double *lineparm,double *err,double *mse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  
  if (i1 == i0) {
    __assert_fail("i0 != i1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0x7f,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  if (((sz <= i1) || (sz - i0 == 0 || sz < i0)) || ((i1 | i0) < 0)) {
    __assert_fail("i0 >= 0 && i1 >= 0 && i0 < sz && i1 < sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0x80,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  iVar5 = i1 - i0;
  if (iVar5 == 0 || i1 < i0) {
    if (i0 < 1) {
      __assert_fail("i0 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                    ,0x9a,
                    "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                   );
    }
    auVar18._0_8_ = lfps[(uint)i1].Mx + (lfps[(long)sz + -1].Mx - lfps[(ulong)(uint)i0 - 1].Mx);
    auVar18._8_8_ = lfps[(uint)i1].My + (lfps[(long)sz + -1].My - lfps[(ulong)(uint)i0 - 1].My);
    dVar15 = lfps[(uint)i1].Mxx + (lfps[(long)sz + -1].Mxx - lfps[(ulong)(uint)i0 - 1].Mxx);
    dVar16 = (&lfps[(uint)i1].Mxx)[1] +
             ((&lfps[(long)sz + -1].Mxx)[1] - (&lfps[(ulong)(uint)i0 - 1].Mxx)[1]);
    dVar12 = lfps[(uint)i1].Mxy + (lfps[(long)sz + -1].Mxy - lfps[(ulong)(uint)i0 - 1].Mxy);
    dVar14 = (&lfps[(uint)i1].Mxy)[1] +
             ((&lfps[(long)sz + -1].Mxy)[1] - (&lfps[(ulong)(uint)i0 - 1].Mxy)[1]);
    iVar5 = (sz - i0) + i1;
  }
  else {
    auVar18._0_8_ = lfps[(uint)i1].Mx;
    auVar18._8_8_ = lfps[(uint)i1].My;
    dVar15 = lfps[(uint)i1].Mxx;
    dVar16 = (&lfps[(uint)i1].Mxx)[1];
    dVar12 = lfps[(uint)i1].Mxy;
    dVar14 = (&lfps[(uint)i1].Mxy)[1];
    if (0 < i0) {
      auVar18._0_8_ = auVar18._0_8_ - lfps[(ulong)(uint)i0 - 1].Mx;
      auVar18._8_8_ = auVar18._8_8_ - lfps[(ulong)(uint)i0 - 1].My;
      dVar12 = dVar12 - lfps[(ulong)(uint)i0 - 1].Mxy;
      dVar14 = dVar14 - (&lfps[(ulong)(uint)i0 - 1].Mxy)[1];
      dVar15 = dVar15 - lfps[(ulong)(uint)i0 - 1].Mxx;
      dVar16 = dVar16 - (&lfps[(ulong)(uint)i0 - 1].Mxx)[1];
    }
  }
  if (0 < iVar5) {
    auVar1._8_4_ = SUB84(dVar14,0);
    auVar1._0_8_ = dVar14;
    auVar1._12_4_ = (int)((ulong)dVar14 >> 0x20);
    auVar18 = divpd(auVar18,auVar1);
    dVar8 = auVar18._0_8_;
    dVar11 = auVar18._8_8_;
    dVar17 = dVar15 / dVar14 - dVar8 * dVar8;
    dVar15 = dVar12 / dVar14 - dVar8 * dVar11;
    dVar16 = dVar16 / dVar14 - dVar11 * dVar11;
    fVar7 = (float)((dVar17 - dVar16) * (dVar17 - dVar16) + dVar15 * 4.0 * dVar15);
    if (fVar7 < 0.0) {
      fVar6 = sqrtf(fVar7);
    }
    else {
      fVar6 = SQRT(fVar7);
    }
    if (lineparm != (double *)0x0) {
      *(undefined1 (*) [16])lineparm = auVar18;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      dVar14 = (dVar16 + dVar17 + (double)fVar7) * 0.5;
      dVar13 = dVar17 - dVar14;
      dVar14 = dVar16 - dVar14;
      dVar8 = dVar13 * dVar13 + dVar15 * dVar15;
      dVar11 = dVar15 * dVar15 + dVar14 * dVar14;
      dVar12 = dVar8;
      if (dVar8 <= dVar11) {
        dVar12 = dVar11;
      }
      dVar12 = (double)SQRT((float)dVar12);
      uVar4 = (uint)(dVar11 < dVar8);
      auVar9._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
      auVar9._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
      auVar9._12_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
      auVar10._0_8_ = ~auVar9._0_8_ & (ulong)dVar15;
      auVar10._8_8_ = ~auVar9._8_8_ & (ulong)dVar14;
      auVar3._8_8_ = (ulong)dVar15 & auVar9._8_8_;
      auVar3._0_8_ = (ulong)dVar13 & auVar9._0_8_;
      auVar2._8_4_ = SUB84(dVar12,0);
      auVar2._0_8_ = dVar12;
      auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
      auVar18 = divpd(auVar10 | auVar3,auVar2);
      *(undefined1 (*) [16])(lineparm + 2) = auVar18;
    }
    dVar15 = ((dVar16 + dVar17) - (double)fVar6) * 0.5;
    if (err != (double *)0x0) {
      *err = (double)(iVar5 + 1) * dVar15;
    }
    if (mse != (double *)0x0) {
      *mse = dVar15;
    }
    return;
  }
  __assert_fail("N >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                ,0xad,
                "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)");
}

Assistant:

void fit_line(struct line_fit_pt *lfps, int sz, int i0, int i1, double *lineparm, double *err, double *mse)
{
    assert(i0 != i1);
    assert(i0 >= 0 && i1 >= 0 && i0 < sz && i1 < sz);

    double Mx, My, Mxx, Myy, Mxy, W;
    int N; // how many points are included in the set?

    if (i0 < i1) {
        N = i1 - i0 + 1;

        Mx  = lfps[i1].Mx;
        My  = lfps[i1].My;
        Mxx = lfps[i1].Mxx;
        Mxy = lfps[i1].Mxy;
        Myy = lfps[i1].Myy;
        W   = lfps[i1].W;

        if (i0 > 0) {
            Mx  -= lfps[i0-1].Mx;
            My  -= lfps[i0-1].My;
            Mxx -= lfps[i0-1].Mxx;
            Mxy -= lfps[i0-1].Mxy;
            Myy -= lfps[i0-1].Myy;
            W   -= lfps[i0-1].W;
        }

    } else {
        // i0 > i1, e.g. [15, 2]. Wrap around.
        assert(i0 > 0);

        Mx  = lfps[sz-1].Mx   - lfps[i0-1].Mx;
        My  = lfps[sz-1].My   - lfps[i0-1].My;
        Mxx = lfps[sz-1].Mxx  - lfps[i0-1].Mxx;
        Mxy = lfps[sz-1].Mxy  - lfps[i0-1].Mxy;
        Myy = lfps[sz-1].Myy  - lfps[i0-1].Myy;
        W   = lfps[sz-1].W    - lfps[i0-1].W;

        Mx  += lfps[i1].Mx;
        My  += lfps[i1].My;
        Mxx += lfps[i1].Mxx;
        Mxy += lfps[i1].Mxy;
        Myy += lfps[i1].Myy;
        W   += lfps[i1].W;

        N = sz - i0 + i1 + 1;
    }

    assert(N >= 2);

    double Ex = Mx / W;
    double Ey = My / W;
    double Cxx = Mxx / W - Ex*Ex;
    double Cxy = Mxy / W - Ex*Ey;
    double Cyy = Myy / W - Ey*Ey;

    //if (1) {
    //    // on iOS about 5% of total CPU spent in these trig functions.
    //    // 85 ms per frame on 5S, example.pnm
    //    //
    //    // XXX this was using the double-precision atan2. Was there a case where
    //    // we needed that precision? Seems doubtful.
    //    double normal_theta = .5 * atan2f(-2*Cxy, (Cyy - Cxx));
    //    nx_old = cosf(normal_theta);
    //    ny_old = sinf(normal_theta);
    //}
    
    // Instead of using the above cos/sin method, pose it as an eigenvalue problem.
    double eig_small = 0.5*(Cxx + Cyy - sqrtf((Cxx - Cyy)*(Cxx - Cyy) + 4*Cxy*Cxy));

    if (lineparm) {
        lineparm[0] = Ex;
        lineparm[1] = Ey;

        double eig = 0.5*(Cxx + Cyy + sqrtf((Cxx - Cyy)*(Cxx - Cyy) + 4*Cxy*Cxy));
        double nx1 = Cxx - eig;
        double ny1 = Cxy;
        double M1 = nx1*nx1 + ny1*ny1;
        double nx2 = Cxy;
        double ny2 = Cyy - eig;
        double M2 = nx2*nx2 + ny2*ny2;

        double nx, ny, M;
        if (M1 > M2) {
            nx = nx1;
            ny = ny1;
            M = M1;
        } else {
            nx = nx2;
            ny = ny2;
            M = M2;
        }

        double length = sqrtf(M);
        lineparm[2] = nx/length;
        lineparm[3] = ny/length;
    }

    // sum of squared errors =
    //
    // SUM_i ((p_x - ux)*nx + (p_y - uy)*ny)^2
    // SUM_i  nx*nx*(p_x - ux)^2 + 2nx*ny(p_x -ux)(p_y-uy) + ny*ny*(p_y-uy)*(p_y-uy)
    //  nx*nx*SUM_i((p_x -ux)^2) + 2nx*ny*SUM_i((p_x-ux)(p_y-uy)) + ny*ny*SUM_i((p_y-uy)^2)
    //
    //  nx*nx*N*Cxx + 2nx*ny*N*Cxy + ny*ny*N*Cyy

    // sum of squared errors
    if (err)
        *err = N*eig_small;

    // mean squared error
    if (mse)
        *mse = eig_small;
}